

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gregorian.cpp
# Opt level: O2

int __thiscall
booster::locale::util::gregorian_calendar::difference
          (gregorian_calendar *this,abstract_calendar *other_cal,period_mark p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  gregorian_calendar *other;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  int diff;
  gregorian_calendar *pgVar4;
  
  if (other_cal == (abstract_calendar *)0x0) {
LAB_001adbfa:
    iVar2 = (**(this->super_abstract_calendar)._vptr_abstract_calendar)(this);
    pgVar4 = (gregorian_calendar *)CONCAT44(extraout_var,iVar2);
    (*other_cal->_vptr_abstract_calendar[5])(other_cal);
    (*(pgVar4->super_abstract_calendar)._vptr_abstract_calendar[4])(pgVar4);
    other = pgVar4;
  }
  else {
    pgVar4 = (gregorian_calendar *)0x0;
    other = (gregorian_calendar *)__dynamic_cast(other_cal,&abstract_calendar::typeinfo,&typeinfo,0)
    ;
    if (other == (gregorian_calendar *)0x0) goto LAB_001adbfa;
  }
  switch(p) {
  case year:
  case extended_year:
    iVar2 = get_diff(this,year,(other->tm_).tm_year - (this->tm_).tm_year,other);
    break;
  case month:
    iVar2 = get_diff(this,month,
                     (((other->tm_).tm_year - (this->tm_).tm_year) * 0xc + (other->tm_).tm_mon) -
                     (this->tm_).tm_mon,other);
    break;
  case day:
  case day_of_year:
  case day_of_week:
  case day_of_week_local:
    iVar1 = 1;
    goto LAB_001adc4a;
  case day_of_week_in_month:
  case week_of_year:
  case week_of_month:
    iVar1 = 7;
LAB_001adc4a:
    iVar2 = (other->tm_).tm_year;
    diff = (other->tm_).tm_yday - (this->tm_).tm_yday;
    iVar3 = (this->tm_).tm_year;
    if (iVar2 != iVar3) {
      iVar2 = anon_unknown_0::days_from_0(iVar2 + 0x76c);
      iVar3 = anon_unknown_0::days_from_0(iVar3 + 0x76c);
      diff = (iVar2 + diff) - iVar3;
    }
    iVar2 = get_diff(this,day,diff,other);
    iVar2 = iVar2 / iVar1;
    break;
  case hour:
  case hour_12:
    lVar5 = other->time_ - this->time_;
    lVar6 = 0xe10;
    goto LAB_001add1a;
  case am_pm:
    lVar5 = other->time_ - this->time_;
    lVar6 = 0xa8c0;
    goto LAB_001add1a;
  case minute:
    lVar5 = other->time_ - this->time_;
    lVar6 = 0x3c;
LAB_001add1a:
    iVar2 = (int)(lVar5 / lVar6);
    break;
  case second:
    iVar2 = (int)other->time_ - (int)this->time_;
    break;
  default:
    iVar2 = 0;
  }
  if (pgVar4 != (gregorian_calendar *)0x0) {
    (*(pgVar4->super_abstract_calendar)._vptr_abstract_calendar[0xe])(pgVar4);
  }
  return iVar2;
}

Assistant:

virtual int difference(abstract_calendar const *other_cal,period::marks::period_mark p) const 
            {
                std::unique_ptr<gregorian_calendar> keeper;
                gregorian_calendar const *other = dynamic_cast<gregorian_calendar const *>(other_cal);
                if(!other) {
                    keeper.reset(clone());
                    keeper->set_time(other_cal->get_time());
                    other = keeper.get();
                }

                int factor = 1; // for weeks vs days handling

                using namespace period::marks;
                switch(p) {
                case era:
                    return 0;
                case year:
                case extended_year:
                    {
                        int diff = other->tm_.tm_year - tm_.tm_year;
                        return get_diff(period::marks::year,diff,other);
                    }
                case month:
                    {
                        int diff = 12 * (other->tm_.tm_year - tm_.tm_year) 
                                    + other->tm_.tm_mon - tm_.tm_mon;
                        return get_diff(period::marks::month,diff,other);
                    }
                case day_of_week_in_month:
                case week_of_month:
                case week_of_year:
                    factor = 7;
                    // fall 
                case day:
                case day_of_year:
                case day_of_week:
                case day_of_week_local:
                    {
                        int diff = other->tm_.tm_yday - tm_.tm_yday;
                        if(other->tm_.tm_year != tm_.tm_year) {
                            diff += days_from_0(other->tm_.tm_year + 1900) -
                                    days_from_0(tm_.tm_year + 1900);
                        }
                        return get_diff(period::marks::day,diff,other) / factor;
                    }
                case am_pm:
                    return static_cast<int>( (other->time_ - time_) / (3600*12) );
                case hour:
                case hour_12:
                    return static_cast<int>( (other->time_ - time_) / 3600 );
                case minute:
                    return static_cast<int>( (other->time_ - time_) / 60 );
                case second:
                    return static_cast<int>( other->time_ - time_  );
                default:
                    return 0;
                };
            }